

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

complex<float> * __thiscall
TPZFMatrix<std::complex<float>_>::operator()(TPZFMatrix<std::complex<float>_> *this,int64_t row)

{
  int64_t row_local;
  TPZFMatrix<std::complex<float>_> *this_local;
  
  return this->fElem + row;
}

Assistant:

inline TVar &TPZFMatrix<TVar>::operator()(const int64_t row) {
#ifdef PZDEBUG
    if(row >=  this->Rows() || row<0) {
        Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        DebugStop();
    }
#endif
    return *(this->fElem+row);
}